

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O2

void uo_cb_prepend_cb(uo_cb *cb,uo_cb *cb_before)

{
  uo_linklist *puVar1;
  
  uo_stack_push_arr(&cb->stack,(cb_before->stack).items,(cb_before->stack).count);
  puVar1 = &cb_before->funclist;
  while (puVar1 = puVar1->prev, puVar1 != &cb_before->funclist) {
    uo_cb_prepend_func(cb,(uo_cb_func)puVar1[1].next);
  }
  return;
}

Assistant:

void uo_cb_prepend_cb(
    uo_cb *cb,
    uo_cb *cb_before)
{
    uo_stack_push_arr(&cb->stack, cb_before->stack.items, cb_before->stack.count);

    uo_linklist *link = cb_before->funclist.prev;

    while (link != &cb_before->funclist)
    {
        uo_cb_prepend_func(cb, ((uo_cb_func_linklist *)link)->item);
        link = link->prev;
    }
}